

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cut.cpp
# Opt level: O0

bool bfs_dinic(int s,int t)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  reference this;
  reference piVar6;
  reference pvVar7;
  bool bVar8;
  int local_90;
  int local_8c;
  int next;
  int ind;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int v;
  undefined1 local_60 [8];
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int t_local;
  int s_local;
  
  q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish._M_node.
  _0_4_ = t;
  q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish._M_node.
  _4_4_ = s;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)local_60);
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_60,
             (value_type *)
             ((long)&q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
                     ._M_finish._M_node + 4));
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::dis,
                      (long)q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node._4_4_);
  *pvVar4 = 0;
  while( true ) {
    bVar3 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                      ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_60);
    bVar8 = false;
    if (!bVar3) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::dis,
                          (long)(int)q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                     super__Deque_impl_data._M_finish._M_node);
      bVar8 = *pvVar4 == -1;
    }
    if (!bVar8) break;
    pvVar5 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                       ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_60);
    iVar2 = *pvVar5;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_60);
    this = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)(anonymous_namespace)::edges_dup,(long)iVar2);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(this);
    _next = std::vector<int,_std::allocator<int>_>::end(this);
    while (bVar8 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)&next), bVar8) {
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_8c = *piVar6;
      pvVar7 = std::
               vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
               ::operator[]((vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                             *)(anonymous_namespace)::edgelist,(long)local_8c);
      local_90 = pvVar7->b;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::dis,
                          (long)local_90);
      if (*pvVar4 == -1) {
        pvVar7 = std::
                 vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                 ::operator[]((vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                               *)(anonymous_namespace)::edgelist,(long)local_8c);
        iVar1 = pvVar7->flow;
        pvVar7 = std::
                 vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                 ::operator[]((vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                               *)(anonymous_namespace)::edgelist,(long)local_8c);
        if (iVar1 < pvVar7->c) {
          std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                    ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_60,&local_90);
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::dis,
                              (long)iVar2);
          iVar1 = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::dis,
                              (long)local_90);
          *pvVar4 = iVar1 + 1;
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::dis,
                      (long)(int)q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                 super__Deque_impl_data._M_finish._M_node);
  iVar2 = *pvVar4;
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_60);
  return iVar2 != -1;
}

Assistant:

bool bfs_dinic(int s, int t) {
    queue<int> q;
    q.push(s);
    dis[s] = 0;
    
    while (!q.empty() && dis[t] == -1) {
        int v = q.front();
        q.pop();
        
        for (int ind : edges_dup[v]) {
            int next = edgelist[ind].b;
            
            if (dis[next] == -1 && edgelist[ind].flow < edgelist[ind].c) {
                q.push(next);
                dis[next] = dis[v] + 1;
            }
        }
    }
    
    return dis[t] != -1;
}